

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_setenv(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  char *__name;
  char *__value;
  ulong uVar2;
  
  __name = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__name == (char *)0x0) {
    uVar2 = 6;
  }
  else {
    __value = JS_ToCStringLen2(ctx,(size_t *)0x0,argv[1],0);
    if (__value == (char *)0x0) {
      uVar2 = 6;
    }
    else {
      setenv(__name,__value,1);
      JS_FreeCString(ctx,__name);
      uVar2 = 3;
      __name = __value;
    }
    JS_FreeCString(ctx,__name);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSValue js_std_setenv(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *name, *value;
    name = JS_ToCString(ctx, argv[0]);
    if (!name)
        return JS_EXCEPTION;
    value = JS_ToCString(ctx, argv[1]);
    if (!value) {
        JS_FreeCString(ctx, name);
        return JS_EXCEPTION;
    }
    setenv(name, value, TRUE);
    JS_FreeCString(ctx, name);
    JS_FreeCString(ctx, value);
    return JS_UNDEFINED;
}